

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::init
          (SamplerBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  pointer puVar2;
  RenderContext *pRVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int texNdx;
  long lVar7;
  long lVar8;
  Vec4 *color;
  allocator_type local_a9;
  long local_a8;
  long local_a0;
  long local_98;
  ConstPixelBufferAccess local_90;
  TextureLevel level;
  Random rnd;
  
  LayoutBindingRenderCase::init(&this->super_LayoutBindingRenderCase,ctx);
  iVar4 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_a8 = CONCAT44(extraout_var,iVar4);
  dVar5 = deStringHash((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5 ^ 0xff23a4);
  local_90.m_format = (TextureFormat)((ulong)local_90.m_format.type << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&level,
             (long)(this->super_LayoutBindingRenderCase).m_numBindings,
             (value_type_conflict4 *)&local_90,&local_a9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&this->m_textures,&level)
  ;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&level);
  iVar4 = 0;
  while( true ) {
    if ((int)((ulong)((long)(this->m_textures).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->m_textures).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) <= iVar4) break;
    getRandomColor((anon_unknown_1 *)&level,(Random *)&rnd.m_rnd);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
               &this->m_textureColors,(Vector<float,_4> *)&level);
    iVar4 = iVar4 + 1;
  }
  (**(code **)(local_a8 + 0x6f8))();
  lVar7 = 0;
  lVar8 = 0;
  do {
    puVar2 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_textures).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar2) >> 2) <= lVar8) {
      iVar4 = (**(code **)(local_a8 + 8))(0x84c0);
      return iVar4;
    }
    uVar1 = puVar2[lVar8];
    color = (Vec4 *)((long)((this->m_textureColors).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7);
    iVar4 = (this->super_LayoutBindingRenderCase).m_bindings.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar8];
    local_a0 = lVar8;
    local_98 = lVar7;
    iVar6 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var_00,iVar6);
    (**(code **)(lVar7 + 8))(iVar4 + 0x84c0);
    (**(code **)(lVar7 + 0xb8))(this->m_textureType,uVar1);
    (**(code **)(lVar7 + 0x1360))(this->m_textureType,0x2801,0x2601);
    if (this->m_textureType == 0x806f) {
      local_90.m_format.order = RGBA;
      local_90.m_format.type = UNORM_INT8;
      tcu::TextureLevel::TextureLevel(&level,&local_90.m_format,1,1,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_90,&level);
      tcu::clear((PixelBufferAccess *)&local_90,color);
      pRVar3 = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
      dVar5 = this->m_textureType;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_90,&level);
      glu::texImage3D(pRVar3,dVar5,0,0x8058,&local_90);
LAB_01235e16:
      tcu::TextureLevel::~TextureLevel(&level);
    }
    else if (this->m_textureType == 0xde1) {
      local_90.m_format.order = RGBA;
      local_90.m_format.type = UNORM_INT8;
      tcu::TextureLevel::TextureLevel(&level,&local_90.m_format,1,1,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_90,&level);
      tcu::clear((PixelBufferAccess *)&local_90,color);
      pRVar3 = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
      dVar5 = this->m_textureType;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_90,&level);
      glu::texImage2D(pRVar3,dVar5,0,0x8058,&local_90);
      goto LAB_01235e16;
    }
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Texture initialization failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                    ,0x4a2);
    lVar8 = local_a0 + 1;
    lVar7 = local_98 + 0x10;
  } while( true );
}

Assistant:

void SamplerBindingRenderCase::init (void)
{
	LayoutBindingRenderCase::init();
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	de::Random				rnd		(deStringHash(getName()) ^ 0xff23a4);


	// Initialize texture resources
	m_textures = std::vector<glw::GLuint>(m_numBindings,  0);

	// Texture colors
	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		m_textureColors.push_back(getRandomColor(rnd));

	// Textures
	gl.genTextures((glw::GLsizei)m_textures.size(), &m_textures[0]);

	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		initializeTexture(m_bindings[texNdx], m_textures[texNdx], m_textureColors[texNdx]);

	gl.activeTexture(GL_TEXTURE0);
}